

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O0

int xmlParse3986DecOctet(char **str)

{
  char *local_20;
  char *cur;
  char **str_local;
  
  local_20 = *str;
  if ((*local_20 < '0') || ('9' < *local_20)) {
    str_local._4_4_ = 1;
  }
  else {
    if ((local_20[1] < '0') || ('9' < local_20[1])) {
      local_20 = local_20 + 1;
    }
    else if ((((*local_20 == '0') || (local_20[1] < '0')) || ('9' < local_20[1])) ||
            (('/' < local_20[2] && (local_20[2] < ':')))) {
      if (((((*local_20 != '1') || ((local_20[1] < '0' || ('9' < local_20[1])))) ||
           ((local_20[2] < '0' || ('9' < local_20[2])))) &&
          ((((*local_20 != '2' || (local_20[1] < '0')) || ('4' < local_20[1])) ||
           ((local_20[2] < '0' || ('9' < local_20[2])))))) &&
         (((*local_20 != '2' || ((local_20[1] != '5' || (local_20[2] < '0')))) ||
          ('5' < local_20[1])))) {
        return 1;
      }
      local_20 = local_20 + 3;
    }
    else {
      local_20 = local_20 + 2;
    }
    *str = local_20;
    str_local._4_4_ = 0;
  }
  return str_local._4_4_;
}

Assistant:

static int
xmlParse3986DecOctet(const char **str) {
    const char *cur = *str;

    if (!(ISA_DIGIT(cur)))
        return(1);
    if (!ISA_DIGIT(cur+1))
	cur++;
    else if ((*cur != '0') && (ISA_DIGIT(cur + 1)) && (!ISA_DIGIT(cur+2)))
	cur += 2;
    else if ((*cur == '1') && (ISA_DIGIT(cur + 1)) && (ISA_DIGIT(cur + 2)))
	cur += 3;
    else if ((*cur == '2') && (*(cur + 1) >= '0') &&
	     (*(cur + 1) <= '4') && (ISA_DIGIT(cur + 2)))
	cur += 3;
    else if ((*cur == '2') && (*(cur + 1) == '5') &&
	     (*(cur + 2) >= '0') && (*(cur + 1) <= '5'))
	cur += 3;
    else
        return(1);
    *str = cur;
    return(0);
}